

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bip32.c
# Opt level: O2

int bip32_key_from_seed(uchar *bytes,size_t bytes_len,uint32_t version,uint32_t flags,
                       ext_key *key_out)

{
  int iVar1;
  secp256k1_context_struct *ctx;
  int iVar2;
  sha512 sha;
  
  iVar2 = -2;
  if ((((bytes != (uchar *)0x0) && (bytes_len - 0x10 < 0x31)) &&
      ((0x1000000010001U >> (bytes_len - 0x10 & 0x3f) & 1) != 0)) &&
     (((version == 0x488ade4 || (version == 0x4358394)) &&
      (key_out != (ext_key *)0x0 && (flags & 0xfffffffd) == 0)))) {
    wally_clear(key_out,0xc0);
    key_out->version = version;
    ctx = secp_ctx();
    if (ctx == (secp256k1_context_struct *)0x0) {
      iVar2 = -3;
    }
    else {
      hmac_sha512_impl(&sha,"Bitcoin seed",0xc,bytes,bytes_len);
      iVar1 = secp256k1_ec_seckey_verify(ctx,(uchar *)&sha);
      if (iVar1 == 0) {
        wally_clear(&sha,0x40);
        iVar2 = -1;
      }
      else {
        key_out->priv_key[0] = '\0';
        *(uint64_t *)(key_out->priv_key + 1) = sha.u.u64[0];
        *(uint64_t *)(key_out->priv_key + 9) = sha.u.u64[1];
        *(uint64_t *)(key_out->priv_key + 0x11) = sha.u.u64[2];
        *(uint64_t *)(key_out->priv_key + 0x19) = sha.u.u64[3];
        iVar1 = key_compute_pub_key(key_out);
        if (iVar1 == 0) {
          *(uint64_t *)(key_out->chain_code + 0x10) = sha.u.u64[6];
          *(uint64_t *)(key_out->chain_code + 0x18) = sha.u.u64[7];
          *(uint64_t *)key_out->chain_code = sha.u.u64[4];
          *(uint64_t *)(key_out->chain_code + 8) = sha.u.u64[5];
          key_out->depth = '\0';
          key_out->child_num = 0;
          if (flags == 0) {
            key_compute_hash160(key_out);
          }
          wally_clear(&sha,0x40);
          iVar2 = 0;
        }
        else {
          wally_clear_2(&sha,0x40,key_out,0xc0);
        }
      }
    }
  }
  return iVar2;
}

Assistant:

int bip32_key_from_seed(const unsigned char *bytes, size_t bytes_len,
                        uint32_t version, uint32_t flags,
                        struct ext_key *key_out)
{
    const secp256k1_context *ctx;
    struct sha512 sha;

    if (!bytes || !is_valid_seed_len(bytes_len) ||
        !version_is_valid(version, BIP32_FLAG_KEY_PRIVATE) ||
        (flags & ~BIP32_FLAG_SKIP_HASH) || !key_out)
        return WALLY_EINVAL;

    wally_clear(key_out, sizeof(*key_out));
    key_out->version = version;

    if (!(ctx = secp_ctx()))
        return WALLY_ENOMEM;

    /* Generate private key and chain code */
    hmac_sha512_impl(&sha, SEED, sizeof(SEED), bytes, bytes_len);

    /* Check that the generated private key is valid */
    if (!secp256k1_ec_seckey_verify(ctx, sha.u.u8)) {
        wally_clear(&sha, sizeof(sha));
        return WALLY_ERROR; /* Invalid private key */
    }

    /* Copy the private key and set its prefix */
    key_out->priv_key[0] = BIP32_FLAG_KEY_PRIVATE;
    memcpy(key_out->priv_key + 1, sha.u.u8, sizeof(sha) / 2);
    if (key_compute_pub_key(key_out) != WALLY_OK) {
        wally_clear_2(&sha, sizeof(sha), key_out, sizeof(*key_out));
        return WALLY_EINVAL;
    }

    /* Copy the chain code */
    memcpy(key_out->chain_code, sha.u.u8 + sizeof(sha) / 2, sizeof(sha) / 2);

    key_out->depth = 0; /* Master key, depth 0 */
    key_out->child_num = 0;
    if (!(flags & BIP32_FLAG_SKIP_HASH))
        key_compute_hash160(key_out);
    wally_clear(&sha, sizeof(sha));
    return WALLY_OK;
}